

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_attachment_base<VkAttachmentDescription2>
               (Hasher *h,VkAttachmentDescription2 *att)

{
  VkAttachmentDescription2 *att_local;
  Hasher *h_local;
  
  Hasher::u32(h,att->flags);
  Hasher::u32(h,att->initialLayout);
  Hasher::u32(h,att->finalLayout);
  Hasher::u32(h,att->format);
  Hasher::u32(h,att->loadOp);
  Hasher::u32(h,att->storeOp);
  Hasher::u32(h,att->stencilLoadOp);
  Hasher::u32(h,att->stencilStoreOp);
  Hasher::u32(h,att->samples);
  return;
}

Assistant:

static void hash_attachment_base(Hasher &h, const Att &att)
{
	h.u32(att.flags);
	h.u32(att.initialLayout);
	h.u32(att.finalLayout);
	h.u32(att.format);
	h.u32(att.loadOp);
	h.u32(att.storeOp);
	h.u32(att.stencilLoadOp);
	h.u32(att.stencilStoreOp);
	h.u32(att.samples);
}